

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

int mcpl_internal_do_gzip(char *filename)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  char *__dest;
  gzFile pgVar3;
  ulong uVar4;
  char *in_RDI;
  size_t len;
  char buf [16384];
  gzFile handle_out;
  char *outfn;
  size_t nn;
  FILE *handle_in;
  size_t in_stack_ffffffffffffbfc0;
  char *in_stack_ffffffffffffbfc8;
  char *in_stack_ffffffffffffbfd0;
  char *in_stack_ffffffffffffbff8;
  char *in_stack_ffffffffffffc000;
  
  __stream = (FILE *)mcpl_internal_fopen(in_stack_ffffffffffffbfd0,in_stack_ffffffffffffbfc8);
  if (__stream != (FILE *)0x0) {
    sVar2 = strlen(in_RDI);
    __dest = mcpl_internal_malloc(in_stack_ffffffffffffbfc0);
    memcpy(__dest,in_RDI,sVar2);
    builtin_strncpy(__dest + sVar2,".gz",4);
    pgVar3 = mcpl_gzopen(in_stack_ffffffffffffc000,in_stack_ffffffffffffbff8);
    free(__dest);
    if (pgVar3 == (gzFile)0x0) {
      fclose(__stream);
    }
    else {
      do {
        sVar2 = fread(&stack0xffffffffffffbfc8,1,0x4000,__stream);
        uVar4 = (ulong)(int)sVar2;
        iVar1 = ferror(__stream);
        if (iVar1 != 0) {
          fclose(__stream);
          gzclose(pgVar3);
          return 0;
        }
        if (uVar4 == 0) {
          fclose(__stream);
          iVar1 = gzclose(pgVar3);
          if (iVar1 == 0) {
            mcpl_internal_delete_file((char *)0x10a2bd);
            return 1;
          }
          return 0;
        }
        iVar1 = gzwrite(pgVar3,&stack0xffffffffffffbfc8,uVar4 & 0xffffffff);
      } while ((long)iVar1 == uVar4);
      fclose(__stream);
      gzclose(pgVar3);
    }
  }
  return 0;
}

Assistant:

MCPL_LOCAL int mcpl_internal_do_gzip(const char *filename)
{
  //Open input file:
  FILE *handle_in = mcpl_internal_fopen(filename, "rb");
  if (!handle_in)
    return 0;

  //Construct output file name by appending .gz:
  size_t nn = strlen(filename);
  char * outfn = mcpl_internal_malloc(nn + 4);
  memcpy(outfn,filename,nn);
  memcpy(outfn+nn,".gz",4);

  //Open output file:
  gzFile handle_out = mcpl_gzopen(outfn, "wb");

  free(outfn);

  if (!handle_out) {
    fclose(handle_in);
    return 0;
  }

  //Compress input to output:
  char buf[16384];
  size_t len;
  while (1) {
    len = (int)fread(buf, 1, sizeof(buf), handle_in);
    if (ferror(handle_in)) {
      fclose(handle_in);
      gzclose(handle_out);
      return 0;
    }
    if (!len)
      break;
    if ((size_t)gzwrite(handle_out, buf, (unsigned)len) != len) {
      fclose(handle_in);
      gzclose(handle_out);
      return 0;
    }
  }

  //close file:
  fclose(handle_in);
  if (gzclose(handle_out) != Z_OK)
    return 0;

  //remove input file and return success:
  mcpl_internal_delete_file( filename );
  return 1;

}